

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

bool __thiscall ftxui::HorizontalContainer::EventHandler(HorizontalContainer *this,Event *event)

{
  int iVar1;
  size_t sVar2;
  int *piVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  Event local_b0;
  Event local_70;
  
  iVar1 = *(this->super_ContainerBase).selector_;
  bVar4 = Event::operator==(event,(Event *)Event::ArrowLeft);
  bVar7 = true;
  if (!bVar4) {
    Event::Character(&local_70,'h');
    sVar2 = (event->input_)._M_string_length;
    if (sVar2 == local_70.input_._M_string_length) {
      if (sVar2 != 0) {
        iVar5 = bcmp((event->input_)._M_dataplus._M_p,local_70.input_._M_dataplus._M_p,sVar2);
        bVar7 = iVar5 == 0;
      }
    }
    else {
      bVar7 = false;
    }
  }
  if ((!bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.input_._M_dataplus._M_p != &local_70.input_.field_2)) {
    operator_delete(local_70.input_._M_dataplus._M_p,
                    local_70.input_.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    ContainerBase::MoveSelector(&this->super_ContainerBase,-1);
  }
  bVar4 = Event::operator==(event,(Event *)Event::ArrowRight);
  bVar7 = true;
  if (!bVar4) {
    Event::Character(&local_b0,'l');
    sVar2 = (event->input_)._M_string_length;
    if (sVar2 == local_b0.input_._M_string_length) {
      if (sVar2 != 0) {
        iVar5 = bcmp((event->input_)._M_dataplus._M_p,local_b0.input_._M_dataplus._M_p,sVar2);
        bVar7 = iVar5 == 0;
      }
    }
    else {
      bVar7 = false;
    }
  }
  if ((!bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.input_._M_dataplus._M_p != &local_b0.input_.field_2)) {
    operator_delete(local_b0.input_._M_dataplus._M_p,
                    local_b0.input_.field_2._M_allocated_capacity + 1);
  }
  if (bVar7) {
    ContainerBase::MoveSelector(&this->super_ContainerBase,1);
  }
  bVar7 = Event::operator==(event,(Event *)Event::Tab);
  if ((bVar7) &&
     ((this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,1);
  }
  bVar7 = Event::operator==(event,(Event *)Event::TabReverse);
  if ((bVar7) &&
     ((this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->super_ContainerBase).super_ComponentBase.children_.
      super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    ContainerBase::MoveSelectorWrap(&this->super_ContainerBase,-1);
  }
  piVar3 = (this->super_ContainerBase).selector_;
  iVar6 = (int)((ulong)((long)(this->super_ContainerBase).super_ComponentBase.children_.
                              super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->super_ContainerBase).super_ComponentBase.children_.
                             super__Vector_base<std::shared_ptr<ftxui::ComponentBase>,_std::allocator<std::shared_ptr<ftxui::ComponentBase>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
  iVar5 = *piVar3;
  if (iVar5 < iVar6) {
    iVar6 = iVar5;
  }
  iVar5 = 0;
  if (0 < iVar6) {
    iVar5 = iVar6;
  }
  *piVar3 = iVar5;
  return iVar1 != iVar5;
}

Assistant:

bool EventHandler(Event event) override {
    int old_selected = *selector_;
    if (event == Event::ArrowLeft || event == Event::Character('h'))
      MoveSelector(-1);
    if (event == Event::ArrowRight || event == Event::Character('l'))
      MoveSelector(+1);
    if (event == Event::Tab && children_.size())
      MoveSelectorWrap(+1);
    if (event == Event::TabReverse && children_.size())
      MoveSelectorWrap(-1);

    *selector_ = std::max(0, std::min(int(children_.size()) - 1, *selector_));
    return old_selected != *selector_;
  }